

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O0

_Bool array_container_is_subset_bitset(array_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  int *in_RSI;
  int *in_RDI;
  int i;
  uint16_t in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  _Bool local_1;
  
  if ((*in_RSI == -1) || (*in_RDI <= *in_RSI)) {
    for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
      _Var1 = bitset_container_contains
                        ((bitset_container_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffde);
      if (!_Var1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool array_container_is_subset_bitset(const array_container_t* container1,
                                      const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < container1->cardinality) {
            return false;
        }
    }
    for (int i = 0; i < container1->cardinality; ++i) {
        if (!bitset_container_contains(container2, container1->array[i])) {
            return false;
        }
    }
    return true;
}